

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O1

SW_FT_Error ft_stroker_arcto(SW_FT_Stroker stroker,SW_FT_Int side)

{
  SW_FT_Byte *pSVar1;
  SW_FT_Vector *pSVar2;
  SW_FT_Byte *pSVar3;
  SW_FT_StrokeBorder pSVar4;
  SW_FT_Angle SVar5;
  long lVar6;
  SW_FT_Fixed SVar7;
  SW_FT_Long SVar8;
  SW_FT_Long SVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  SW_FT_Vector local_98;
  SW_FT_StrokeBorder local_88;
  SW_FT_Fixed local_80;
  long local_78;
  ulong local_70;
  long local_68;
  long local_60;
  SW_FT_Stroker local_58;
  long local_50;
  SW_FT_Vector local_48;
  
  local_80 = stroker->radius;
  uVar11 = (ulong)(uint)side;
  SVar5 = SW_FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
  lVar14 = uVar11 * 0x1680000 + -0xb40000;
  if (SVar5 != 0xb40000) {
    lVar14 = SVar5;
  }
  local_88 = stroker->borders + uVar11;
  lVar6 = -lVar14;
  if (0 < lVar14) {
    lVar6 = lVar14;
  }
  if (lVar6 < 0x5a0001) {
    lVar6 = 0x5a0000;
  }
  lVar10 = uVar11 * -0xb40000 + stroker->angle_in + 0x5a0000;
  uVar11 = (lVar6 - 1U) / 0x5a0000 + 1;
  SVar7 = SW_FT_Tan(lVar14 / (long)(ulong)(uint)((int)uVar11 * 4));
  lVar6 = SVar7 / 3 + SVar7;
  local_68 = lVar10;
  SW_FT_Vector_From_Polar(&local_48,local_80,lVar10);
  SVar8 = SW_FT_MulFix(-local_48.y,lVar6);
  local_78 = lVar6;
  SVar9 = SW_FT_MulFix(local_48.x,lVar6);
  local_48.x = (stroker->center).x + local_48.x;
  local_48.y = (stroker->center).y + local_48.y;
  lVar6 = local_48.x + SVar8;
  lVar10 = local_48.y + SVar9;
  local_50 = (uVar11 & 0xffffffff) + (ulong)((uVar11 & 0xffffffff) == 0);
  local_70 = uVar11;
  local_60 = lVar14;
  local_58 = stroker;
  do {
    SW_FT_Vector_From_Polar(&local_98,local_80,lVar14 / (long)local_70 + local_68);
    lVar12 = local_78;
    SVar8 = SW_FT_MulFix(local_98.y,local_78);
    SVar9 = SW_FT_MulFix(-local_98.x,lVar12);
    pSVar4 = local_88;
    local_98.x = (local_58->center).x + local_98.x;
    local_98.y = (local_58->center).y + local_98.y;
    lVar12 = local_98.x + SVar8;
    lVar13 = local_98.y + SVar9;
    ft_stroke_border_grow(local_88,3);
    pSVar2 = pSVar4->points;
    uVar11 = (ulong)pSVar4->num_points;
    pSVar3 = pSVar4->tags;
    pSVar2[uVar11].x = lVar6;
    pSVar2[uVar11].y = lVar10;
    pSVar2[uVar11 + 1].x = lVar12;
    pSVar2[uVar11 + 1].y = lVar13;
    pSVar2[uVar11 + 2].x = local_98.x;
    pSVar2[uVar11 + 2].y = local_98.y;
    pSVar1 = pSVar3 + uVar11;
    pSVar1[0] = '\x02';
    pSVar1[1] = '\x02';
    pSVar3[uVar11 + 2] = '\x01';
    pSVar4->num_points = pSVar4->num_points + 3;
    pSVar4->movable = '\0';
    lVar6 = local_98.x * 2 - lVar12;
    lVar10 = local_98.y * 2 - lVar13;
    lVar14 = lVar14 + local_60;
    local_50 = local_50 + -1;
  } while (local_50 != 0);
  local_88->movable = '\0';
  return (SW_FT_Error)local_88;
}

Assistant:

static SW_FT_Error ft_stroker_arcto(SW_FT_Stroker stroker, SW_FT_Int side)
{
    SW_FT_Angle        total, rotate;
    SW_FT_Fixed        radius = stroker->radius;
    SW_FT_Error        error = 0;
    SW_FT_StrokeBorder border = stroker->borders + side;

    rotate = SW_FT_SIDE_TO_ROTATE(side);

    total = SW_FT_Angle_Diff(stroker->angle_in, stroker->angle_out);
    if (total == SW_FT_ANGLE_PI) total = -rotate * 2;

    error = ft_stroke_border_arcto(border, &stroker->center, radius,
                                   stroker->angle_in + rotate, total);
    border->movable = FALSE;
    return error;
}